

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::hasValidNumericalWordStart(string *ustring)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  bool local_39;
  allocator local_25 [20];
  allocator local_11;
  string *local_10;
  string *ustring_local;
  
  local_10 = ustring;
  if (hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                 first_letters_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 &hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_,
                 "otfsenhmbtzaOTFSENHMBTZA",&local_11);
      std::allocator<char>::~allocator((allocator<char> *)&local_11);
      __cxa_atexit(std::__cxx11::string::~string,
                   &hasValidNumericalWordStart(std::__cxx11::string_const&)::
                    first_letters_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                           first_letters_abi_cxx11_);
    }
  }
  if (hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                 second_letters_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 &hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_
                 ,"nwhoielurNWHOIELUR",local_25);
      std::allocator<char>::~allocator((allocator<char> *)local_25);
      __cxa_atexit(std::__cxx11::string::~string,
                   &hasValidNumericalWordStart(std::__cxx11::string_const&)::
                    second_letters_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                           second_letters_abi_cxx11_);
    }
  }
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
  lVar3 = std::__cxx11::string::find_first_of(-0x80,(ulong)(uint)(int)*pcVar2);
  local_39 = false;
  if (lVar3 != -1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
    lVar3 = std::__cxx11::string::find_first_of(-0x58,(ulong)(uint)(int)*pcVar2);
    local_39 = lVar3 != -1;
  }
  return local_39;
}

Assistant:

static bool hasValidNumericalWordStart(const std::string& ustring)
{  // do a check if the first and second letters make sense
    static const std::string first_letters = "otfsenhmbtzaOTFSENHMBTZA";
    static const std::string second_letters = "nwhoielurNWHOIELUR";
    return (
        first_letters.find_first_of(ustring[0]) != std::string::npos &&
        second_letters.find_first_of(ustring[1]) != std::string::npos);
}